

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveInstantiation.cpp
# Opt level: O3

VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>
 __thiscall
Inferences::PrimitiveInstantiation::ApplicableRewritesFn::operator()
          (ApplicableRewritesFn *this,Literal *l)

{
  SubscriptionData *pSVar1;
  RefCounter *pRVar2;
  uint64_t uVar3;
  TermList term;
  _func_int *p_Var4;
  TermList TVar5;
  TermList TVar6;
  PrimitiveInstantiationIndex *pPVar7;
  ulong uVar8;
  Literal *in_RDX;
  TermList head;
  RefCounter *local_68;
  TermList local_60;
  TermStack local_58;
  
  uVar8 = (ulong)(*(uint *)&(in_RDX->super_Term).field_0xc & 0xfffffff);
  uVar3 = (in_RDX->super_Term)._args[uVar8 - 1]._content;
  term._content = (in_RDX->super_Term)._args[uVar8]._content;
  TVar5 = Kernel::SortHelper::getEqualityArgumentSort(in_RDX);
  TVar6 = Kernel::SortHelper::getEqualityArgumentSort(in_RDX);
  local_58._cursor = (TermList *)0x0;
  local_58._end = (TermList *)0x0;
  local_58._capacity = 0;
  local_58._stack = (TermList *)0x0;
  local_60._content = 2;
  ApplicativeHelper::getHeadAndArgs(term,&local_60,&local_58);
  if ((local_60._content & 1) == 0) {
    TVar5 = TVar6;
    term._content = uVar3;
  }
  p_Var4 = (l->super_Term)._vptr_Term[5];
  (**(code **)(*(long *)p_Var4 + 0x18))(&local_68,p_Var4,term._content,TVar5._content,1);
  pPVar7 = (PrimitiveInstantiationIndex *)
           Lib::FixedSizeAllocator<24UL>::alloc
                     ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  if (local_68 == (RefCounter *)0x0) {
    (pPVar7->super_TermIndex<Indexing::TermWithoutValue>).super_Index._vptr_Index =
         (_func_int **)&PTR__ProxyIterator_00b3a4f0;
    (pPVar7->super_TermIndex<Indexing::TermWithoutValue>).super_Index._addedSD._refCnt =
         (RefCounter *)0x0;
    this->_index = pPVar7;
    *(undefined4 *)&(pPVar7->super_TermIndex<Indexing::TermWithoutValue>).super_Index._addedSD._obj
         = 1;
  }
  else {
    local_68[2]._val = local_68[2]._val + 1;
    *(undefined4 *)&(pPVar7->super_TermIndex<Indexing::TermWithoutValue>).super_Index._addedSD._obj
         = 0;
    (pPVar7->super_TermIndex<Indexing::TermWithoutValue>).super_Index._vptr_Index =
         (_func_int **)&PTR__ProxyIterator_00b3a4f0;
    (pPVar7->super_TermIndex<Indexing::TermWithoutValue>).super_Index._addedSD._refCnt = local_68;
    local_68[2]._val = local_68[2]._val + 1;
    this->_index = pPVar7;
    pSVar1 = &(pPVar7->super_TermIndex<Indexing::TermWithoutValue>).super_Index._addedSD;
    *(int *)&pSVar1->_obj = *(int *)&pSVar1->_obj + 1;
    pRVar2 = local_68 + 2;
    pRVar2->_val = pRVar2->_val + -1;
    if (pRVar2->_val == 0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_68 != (RefCounter *)0x0) {
    pRVar2 = local_68 + 2;
    pRVar2->_val = pRVar2->_val + -1;
    if (pRVar2->_val == 0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
  }
  if (local_58._stack != (TermList *)0x0) {
    uVar8 = local_58._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar8 == 0) {
      (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58._stack;
    }
    else if (uVar8 < 0x11) {
      (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_58._stack;
    }
    else if (uVar8 < 0x19) {
      (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_58._stack;
    }
    else if (uVar8 < 0x21) {
      (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_58._stack;
    }
    else if (uVar8 < 0x31) {
      (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_58._stack;
    }
    else if (uVar8 < 0x41) {
      (local_58._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_58._stack;
    }
    else {
      operator_delete(local_58._stack,0x10);
    }
  }
  return (VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>
          )(IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermWithoutValue>_>
            *)this;
}

Assistant:

VirtualIterator<QueryRes<ResultSubstitutionSP, TermWithoutValue>> operator()(Literal* l)
  {
    TermList lhs = *l->nthArgument(0);
    TermList rhs = *l->nthArgument(1);
   
    TypedTermList lhst(lhs, SortHelper::getEqualityArgumentSort(l));
    TypedTermList rhst(rhs, SortHelper::getEqualityArgumentSort(l));

    TermStack args;
    TermList head;

    ApplicativeHelper::getHeadAndArgs(lhs, head, args);
     
    return pvi(_index->getUnifications((head.isVar() ? lhst : rhst)));
  }